

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<int>::Subst_LBackward(TPZMatrix<int> *this,TPZFMatrix<int> *B)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  long lVar6;
  long lVar7;
  int local_44;
  long local_40;
  long local_38;
  
  lVar5 = (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar5 != CONCAT44(extraout_var,iVar2)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LBackward incompatible dimensions \n",(char *)0x0);
  }
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar2) != 0 && -1 < extraout_var_00) {
    lVar5 = (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
    local_40 = CONCAT44(extraout_var_00,iVar2);
    do {
      lVar7 = local_40 + -1;
      if (0 < lVar5) {
        local_38 = 0;
        do {
          lVar5 = local_40;
          iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
          lVar6 = CONCAT44(extraout_var_01,iVar2);
          iVar2 = 0;
          if (lVar5 < lVar6) {
            iVar2 = 0;
            do {
              lVar6 = lVar6 + -1;
              iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                (this,lVar7,lVar6);
              iVar4 = (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                        _vptr_TPZSavable[0x24])(B,lVar6,local_38);
              iVar2 = iVar2 + iVar4 * iVar3;
            } while (local_40 < lVar6);
          }
          lVar5 = local_38;
          local_44 = (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                       _vptr_TPZSavable[0x24])(B,lVar7,local_38);
          local_44 = local_44 - iVar2;
          (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                    (B,lVar7,lVar5,&local_44);
          local_38 = lVar5 + 1;
          lVar5 = (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
        } while (local_38 < lVar5);
      }
      bVar1 = 1 < local_40;
      local_40 = lVar7;
    } while (bVar1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}